

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_write.cpp
# Opt level: O2

void __thiscall UniValue::writeArray(UniValue *this,uint prettyIndent,uint indentLevel,string *s)

{
  pointer pUVar1;
  uint uVar2;
  long in_FS_OFFSET;
  undefined8 local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append(s,"[");
  if (prettyIndent != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append(s,"\n");
  }
  uVar2 = 0;
  while( true ) {
    pUVar1 = (this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) / 0x58) <=
        (ulong)uVar2) break;
    if (prettyIndent != 0) {
      indentStr(prettyIndent,indentLevel,s);
      pUVar1 = (this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    write_abi_cxx11_((UniValue *)&stack0xffffffffffffffa8,uVar2 * 0x58 + (int)pUVar1,
                     (void *)(ulong)prettyIndent,(ulong)(indentLevel + 1));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffffa8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
    if (((long)(this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_finish -
        (long)(this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start) / 0x58 - 1U != (ulong)uVar2) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append(s,",")
      ;
    }
    if (prettyIndent != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (s,"\n");
    }
    uVar2 = uVar2 + 1;
  }
  if (prettyIndent != 0) {
    indentStr(prettyIndent,indentLevel - 1,s);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append(s,"]");
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UniValue::writeArray(unsigned int prettyIndent, unsigned int indentLevel, std::string& s) const
{
    s += "[";
    if (prettyIndent)
        s += "\n";

    for (unsigned int i = 0; i < values.size(); i++) {
        if (prettyIndent)
            indentStr(prettyIndent, indentLevel, s);
        s += values[i].write(prettyIndent, indentLevel + 1);
        if (i != (values.size() - 1)) {
            s += ",";
        }
        if (prettyIndent)
            s += "\n";
    }

    if (prettyIndent)
        indentStr(prettyIndent, indentLevel - 1, s);
    s += "]";
}